

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fpi.cpp
# Opt level: O0

void __thiscall pg::FPISolver::runPar(FPISolver *this)

{
  unsigned_long *puVar1;
  uint64_t *puVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined4 node;
  bool bVar5;
  bool bVar6;
  uint winner_00;
  uint uVar7;
  size_t sVar8;
  ulong uVar9;
  int *piVar10;
  long lVar11;
  long lVar12;
  ostream *poVar13;
  int local_b4;
  undefined1 local_58 [16];
  undefined1 local_48 [24];
  int winner;
  int v;
  FPISolver *this_local;
  bitset *local_20;
  char local_11;
  bitset *local_10;
  
  _winner = this;
  sVar8 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->parity,sVar8);
  sVar8 = Solver::nodecount(&this->super_Solver);
  bitset::resize(&this->distraction,sVar8);
  local_10 = &this->parity;
  puVar1 = local_10->_bits;
  puVar2 = local_10->_bits;
  sVar8 = bitset::num_blocks(local_10);
  local_11 = '\0';
  std::fill<unsigned_long*,char>(puVar1,puVar2 + sVar8,&local_11);
  local_20 = &this->distraction;
  puVar1 = local_20->_bits;
  puVar2 = local_20->_bits;
  sVar8 = bitset::num_blocks(local_20);
  this_local._7_1_ = 0;
  std::fill<unsigned_long*,char>(puVar1,puVar2 + sVar8,(char *)((long)&this_local + 7));
  uVar9 = Solver::nodecount(&this->super_Solver);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar9;
  uVar9 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  piVar10 = (int *)operator_new__(uVar9);
  this->strategy = piVar10;
  uVar9 = Solver::nodecount(&this->super_Solver);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = uVar9;
  uVar9 = SUB168(auVar4 * ZEXT816(4),0);
  if (SUB168(auVar4 * ZEXT816(4),8) != 0) {
    uVar9 = 0xffffffffffffffff;
  }
  piVar10 = (int *)operator_new__(uVar9);
  this->frozen = piVar10;
  piVar10 = this->frozen;
  lVar11 = Solver::nodecount(&this->super_Solver);
  memset(piVar10,0,lVar11 << 2);
  fpi_run_par_RUN(this);
  for (local_48._20_4_ = 0; lVar11 = (long)(int)local_48._20_4_,
      lVar12 = Solver::nodecount(&this->super_Solver), lVar11 < lVar12;
      local_48._20_4_ = local_48._20_4_ + 1) {
    bVar5 = bitset::operator[]((this->super_Solver).disabled,(long)(int)local_48._20_4_);
    if (!bVar5) {
      bitset::operator[]((bitset *)local_48,(size_t)&this->parity);
      bVar5 = bitset::reference::operator_cast_to_bool((reference *)local_48);
      bitset::operator[]((bitset *)local_58,(size_t)&this->distraction);
      bVar6 = bitset::reference::operator_cast_to_bool((reference *)local_58);
      node = local_48._20_4_;
      winner_00 = (uint)(bVar5 != bVar6);
      local_48._16_4_ = winner_00;
      uVar7 = Solver::owner(&this->super_Solver,local_48._20_4_);
      if (winner_00 == uVar7) {
        local_b4 = this->strategy[(int)local_48._20_4_];
      }
      else {
        local_b4 = -1;
      }
      Solver::solve(&this->super_Solver,node,winner_00,local_b4);
    }
  }
  if (this->strategy != (int *)0x0) {
    operator_delete__(this->strategy);
  }
  if (this->frozen != (int *)0x0) {
    operator_delete__(this->frozen);
  }
  poVar13 = std::operator<<((this->super_Solver).logger,"solved with ");
  poVar13 = (ostream *)std::ostream::operator<<(poVar13,this->iterations);
  poVar13 = std::operator<<(poVar13," iterations.");
  std::ostream::operator<<(poVar13,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void
FPISolver::runPar()
{
    /**
     * Allocate and initialize data structures
     */

    parity.resize(nodecount());
    distraction.resize(nodecount());
    parity.reset();
    distraction.reset();
    strategy = new int[nodecount()]; // the current strategy for winning the game
    frozen = new int[nodecount()]; // records for every vertex at which level it is frozen (or 0 if not frozen)

    memset(frozen, 0, sizeof(int[nodecount()])); // initially no vertex is frozen (we don't freeze at level 0)

    RUN(fpi_run_par, this);

    // done
    for (int v=0; v<nodecount(); v++) {
        if (disabled[v]) continue;
        const int winner = parity[v] ^ distraction[v];
        Solver::solve(v, winner, winner == owner(v) ? strategy[v] : -1);
    }

    // free allocated data structures
    delete[] strategy;
    delete[] frozen;

    logger << "solved with " << iterations << " iterations." << std::endl;
}